

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

void __thiscall CTcParser::parse_property(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  ulong uVar2;
  
  CTcTokenizer::next(G_tok);
LAB_001dfd9c:
  do {
    if ((G_tok->curtok_).typ_ == TOKT_SYM) {
      look_up_prop(this,&G_tok->curtok_,1);
      tVar1 = CTcTokenizer::next(G_tok);
      if (tVar1 == TOKT_COMMA) {
LAB_001dfdc9:
        CTcTokenizer::next(G_tok);
        goto LAB_001dfd9c;
      }
      tVar1 = (G_tok->curtok_).typ_;
      if (tVar1 == TOKT_SYM) {
        CTcTokenizer::log_error_curtok(G_tok,0x2bac);
        goto LAB_001dfd9c;
      }
      if ((tVar1 - TOKT_LBRACE < 2) || (tVar1 == TOKT_EOF)) {
        CTcTokenizer::log_error_curtok(G_tok,0x2b07);
        return;
      }
      if (tVar1 == TOKT_SEM) goto LAB_001dfe82;
      CTcTokenizer::log_error_curtok(G_tok,0x2bac);
      CTcTokenizer::next(G_tok);
      tVar1 = (G_tok->curtok_).typ_;
      if (tVar1 == TOKT_COMMA) goto LAB_001dfdc9;
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2bab);
      uVar2 = (ulong)(G_tok->curtok_).typ_;
      if (uVar2 < 0x2b) {
        if (uVar2 != 0x15) {
          if ((0x40001800004U >> (uVar2 & 0x3f) & 1) != 0) {
            return;
          }
          goto LAB_001dfdf8;
        }
LAB_001dfe09:
        CTcTokenizer::next(G_tok);
      }
      else {
LAB_001dfdf8:
        CTcTokenizer::next(G_tok);
        if ((G_tok->curtok_).typ_ == TOKT_COMMA) goto LAB_001dfe09;
      }
      tVar1 = (G_tok->curtok_).typ_;
    }
    if (tVar1 == TOKT_SEM) {
LAB_001dfe82:
      CTcTokenizer::next(G_tok);
      return;
    }
  } while( true );
}

Assistant:

void CTcParser::parse_property(int *err)
{
    int done;
    
    /* skip the 'property' token */
    G_tok->next();

    /* parse property names until we run out */
    for (done = FALSE ; !done ; )
    {
        /* we should be looking at a property name */
        if (G_tok->cur() == TOKT_SYM)
        {
            /* 
             *   look up the property; this will add it to the symbol table
             *   if it isn't already in there, and will generate an error if
             *   it's already defined as something other than a property 
             */
            look_up_prop(G_tok->getcur(), TRUE);
            
            /* skip the symbol and check what follows */
            if (G_tok->next() == TOKT_COMMA)
            {
                /* skip the comma and continue */
                G_tok->next();
            }
            else if (G_tok->cur() == TOKT_SEM)
            {
                /* 
                 *   end of the statement - skip the semicolon and we're
                 *   done 
                 */
                G_tok->next();
                break;
            }
            else
            {
                /* 
                 *   if it's a brace, they probably left out the semicolon;
                 *   if it's a symbol, they probably left out the comma;
                 *   otherwise, it's probably a stray token 
                 */
                switch(G_tok->cur())
                {
                case TOKT_SYM:
                    /* 
                     *   probably left out a comma - flag an error, but
                     *   proceed with parsing this new symbol 
                     */
                    G_tok->log_error_curtok(TCERR_PROPDECL_REQ_COMMA);
                    break;
                    
                case TOKT_LBRACE:
                case TOKT_RBRACE:
                case TOKT_EOF:
                    /* they probably left out the semicolon */
                    G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
                    return;
                    
                default:
                    /* log an error */
                    G_tok->log_error_curtok(TCERR_PROPDECL_REQ_COMMA);
                    
                    /* skip the errant symbol */
                    G_tok->next();
                    
                    /* 
                     *   if a comma follows, something was probably just
                     *   inserted - skip the comma; if a semicolon follows,
                     *   assume we're at the end of the statement 
                     */
                    if (G_tok->cur() == TOKT_COMMA)
                    {
                        /* 
                         *   we're probably okay again - skip the comma and
                         *   continue 
                         */
                        G_tok->next();
                    }
                    else if (G_tok->cur() == TOKT_SEM)
                    {
                        /* skip the semicolon, and we're done */
                        G_tok->next();
                        done = TRUE;
                    }
                    
                    /* proceed with what follows */
                    break;
                }
            }
        }
        else
        {
            /* log an error */
            G_tok->log_error_curtok(TCERR_PROPDECL_REQ_SYM);

            switch(G_tok->cur())
            {
            case TOKT_SEM:
            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_EOF:
                /* they're probably done with the statement */
                return;

            case TOKT_COMMA:
                /* 
                 *   they probably just doubled a comma - skip it and
                 *   continue 
                 */
                G_tok->next();
                break;
                
            default:
                /* skip this token */
                G_tok->next();
                
                /* 
                 *   if a comma follows, they probably put in a keyword or
                 *   something like that - skip the comma and continue 
                 */
                if (G_tok->cur() == TOKT_COMMA)
                    G_tok->next();
                break;
            }
            
            /* if a semicolon follows, we're done */
            if (G_tok->cur() == TOKT_SEM)
            {
                /* skip the semicolon and we're done */
                G_tok->next();
                break;
            }
        }
    }
}